

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::DecodeBbrDataset
                  (Error *__return_storage_ptr__,BbrDataset *aDataset,Response *aResponse)

{
  ErrorCode EVar1;
  Error *pEVar2;
  __shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ByteArray *aRawAddr;
  mapped_type triHostname;
  mapped_type registrarIpv6Addr;
  TlvSet tlvSet;
  BbrDataset dataset;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  undefined1 local_f8 [40];
  __shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> local_d0;
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_c0;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  ushort local_30;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._0_8_ = local_90 + 0x10;
  local_90._8_8_ = 0;
  local_90[0x10] = '\0';
  local_70._M_p = (pointer)&local_60;
  local_68 = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_30 = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  tlv::GetTlvSet((Error *)local_f8,(TlvSet *)&local_c0,&aResponse->mPayload,kMeshCoP);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_f8);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_f8 + 8));
  if (EVar1 == kNone) {
    local_f8[0] = (string)0x43;
    p_Var3 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_c0,local_f8)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)&local_118,
               p_Var3);
    if ((Tlv *)local_118._M_impl.super__Vector_impl_data._M_start != (Tlv *)0x0) {
      tlv::Tlv::GetValueAsString_abi_cxx11_
                ((string *)local_f8,(Tlv *)local_118._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::operator=((string *)local_90,(string *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
      local_30 = local_30 | 0x8000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_118._M_impl.super__Vector_impl_data._M_finish);
    local_f8[0] = (string)0x45;
    p_Var3 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_c0,local_f8)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)&local_118,
               p_Var3);
    if ((Tlv *)local_118._M_impl.super__Vector_impl_data._M_start != (Tlv *)0x0) {
      tlv::Tlv::GetValueAsString_abi_cxx11_
                ((string *)local_f8,(Tlv *)local_118._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::operator=((string *)&local_70,(string *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
      local_30 = local_30 | 0x4000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_118._M_impl.super__Vector_impl_data._M_finish);
    local_f8[0] = (string)0x44;
    p_Var3 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_c0,local_f8)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,p_Var3);
    if (local_d0._M_ptr != (Tlv *)0x0) {
      local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      aRawAddr = tlv::Tlv::GetValue(local_d0._M_ptr);
      Address::Set((Error *)local_f8,(Address *)&local_118,aRawAddr);
      pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_f8);
      EVar1 = pEVar2->mCode;
      std::__cxx11::string::~string((string *)(local_f8 + 8));
      if (EVar1 != kNone) {
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_118);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
        goto LAB_00157c63;
      }
      Address::ToString_abi_cxx11_((string *)local_f8,(Address *)&local_118);
      std::__cxx11::string::operator=((string *)&local_50,(string *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
      local_30 = local_30 | 0x2000;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_118);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
    BbrDataset::operator=(aDataset,(BbrDataset *)local_90);
  }
LAB_00157c63:
  BbrDataset::~BbrDataset((BbrDataset *)local_90);
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodeBbrDataset(BbrDataset &aDataset, const coap::Response &aResponse)
{
    Error       error;
    tlv::TlvSet tlvSet;
    BbrDataset  dataset;

    SuccessOrExit(error = GetTlvSet(tlvSet, aResponse));

    if (auto triHostname = tlvSet[tlv::Type::kTriHostname])
    {
        dataset.mTriHostname = triHostname->GetValueAsString();
        dataset.mPresentFlags |= BbrDataset::kTriHostnameBit;
    }

    if (auto registrarHostname = tlvSet[tlv::Type::kRegistrarHostname])
    {
        dataset.mRegistrarHostname = registrarHostname->GetValueAsString();
        dataset.mPresentFlags |= BbrDataset::kRegistrarHostnameBit;
    }

    if (auto registrarIpv6Addr = tlvSet[tlv::Type::kRegistrarIpv6Address])
    {
        Address addr;

        SuccessOrExit(error = addr.Set(registrarIpv6Addr->GetValue()));

        dataset.mRegistrarIpv6Addr = addr.ToString();
        dataset.mPresentFlags |= BbrDataset::kRegistrarIpv6AddrBit;
    }

    aDataset = dataset;

exit:
    return error;
}